

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darScript.c
# Opt level: O2

Aig_Man_t * Dar_ManChoiceNewAig(Aig_Man_t *pAig,Dch_Pars_t *pPars)

{
  abctime aVar1;
  Vec_Ptr_t *pVVar2;
  abctime aVar3;
  void *pvVar4;
  void *Entry;
  Aig_Man_t *pAVar5;
  Aig_Man_t *pAVar6;
  char *pcVar7;
  char *pcVar8;
  void *Entry_00;
  int iVar9;
  
  iVar9 = pPars->fVerbose;
  aVar1 = Abc_Clock();
  pVVar2 = Dar_ManChoiceSynthesis(pAig,1,1,pPars->fPower,iVar9);
  aVar3 = Abc_Clock();
  pPars->timeSynth = aVar3 - aVar1;
  pvVar4 = Vec_PtrPop(pVVar2);
  Entry = Vec_PtrEntry(pVVar2,0);
  Vec_PtrPush(pVVar2,Entry);
  Vec_PtrWriteEntry(pVVar2,(int)pvVar4,Entry_00);
  pAVar5 = Dch_DeriveTotalAig(pVVar2);
  for (iVar9 = 0; iVar9 < pVVar2->nSize; iVar9 = iVar9 + 1) {
    pAVar6 = (Aig_Man_t *)Vec_PtrEntry(pVVar2,iVar9);
    Aig_ManStop(pAVar6);
  }
  Vec_PtrFree(pVVar2);
  pAVar6 = Dch_ComputeChoices(pAVar5,pPars);
  Aig_ManStop(pAVar5);
  pvVar4 = pAig->pManTime;
  pAig->pManTime = (void *)0x0;
  pcVar7 = Abc_UtilStrsav(pAig->pName);
  pcVar8 = Abc_UtilStrsav(pAig->pSpec);
  pVVar2 = Aig_ManOrderPios(pAVar6,pAig);
  Aig_ManStop(pAig);
  pAVar5 = Aig_ManDupDfsGuided(pAVar6,pVVar2);
  Aig_ManStop(pAVar6);
  Vec_PtrFree(pVVar2);
  pAVar5->pManTime = pvVar4;
  Aig_ManChoiceLevel(pAVar5);
  if (pAVar5->pName != (char *)0x0) {
    free(pAVar5->pName);
    pAVar5->pName = (char *)0x0;
  }
  free(pAVar5->pSpec);
  pAVar5->pName = pcVar7;
  pAVar5->pSpec = pcVar8;
  return pAVar5;
}

Assistant:

Aig_Man_t * Dar_ManChoiceNewAig( Aig_Man_t * pAig, Dch_Pars_t * pPars )
{
//    extern Aig_Man_t * Dch_DeriveTotalAig( Vec_Ptr_t * vAigs );
    extern Aig_Man_t * Dch_ComputeChoices( Aig_Man_t * pAig, Dch_Pars_t * pPars );
    int fVerbose = pPars->fVerbose;
    Aig_Man_t * pMan, * pTemp;
    Vec_Ptr_t * vAigs;
    Vec_Ptr_t * vPios;
    void * pManTime;
    char * pName, * pSpec;
    int i;
    abctime clk;

clk = Abc_Clock();
    vAigs = Dar_ManChoiceSynthesis( pAig, 1, 1, pPars->fPower, fVerbose );
pPars->timeSynth = Abc_Clock() - clk;
    // swap the first and last network
    // this should lead to the primary choice being "better" because of synthesis
    // (it is also important when constructing choices)
    pMan = (Aig_Man_t *)Vec_PtrPop( vAigs );
    Vec_PtrPush( vAigs, Vec_PtrEntry(vAigs,0) );
    Vec_PtrWriteEntry( vAigs, 0, pMan );

    // derive the total AIG
    pMan = Dch_DeriveTotalAig( vAigs );
    // cleanup
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pTemp, i )
        Aig_ManStop( pTemp );
    Vec_PtrFree( vAigs );

    // compute choices
    pMan = Dch_ComputeChoices( pTemp = pMan, pPars );
    Aig_ManStop( pTemp );

    // save useful things
    pManTime = pAig->pManTime; pAig->pManTime = NULL;
    pName = Abc_UtilStrsav( pAig->pName );
    pSpec = Abc_UtilStrsav( pAig->pSpec );

    // create guidence
    vPios = Aig_ManOrderPios( pMan, pAig ); 
    Aig_ManStop( pAig );

    // reconstruct the network
    pMan = Aig_ManDupDfsGuided( pTemp = pMan, vPios );
    Aig_ManStop( pTemp );
    Vec_PtrFree( vPios );

    // reset levels
    pMan->pManTime = pManTime;
    Aig_ManChoiceLevel( pMan );

    // copy names
    ABC_FREE( pMan->pName );
    ABC_FREE( pMan->pSpec );
    pMan->pName = pName;
    pMan->pSpec = pSpec;
    return pMan;
}